

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void M_SetName(Matrix *M,char *Name)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *__dest;
  
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return;
  }
  free(M->Name);
  sVar2 = strlen(Name);
  __dest = (char *)malloc(sVar2 + 1);
  M->Name = __dest;
  if (__dest != (char *)0x0) {
    strcpy(__dest,Name);
    return;
  }
  LASError(LASMemAllocErr,"M_SetName",Name,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void M_SetName(Matrix *M, char *Name)
/* (re)set name of the matrix M */
{
    if (LASResult() == LASOK) {
        free(M->Name);
        M->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
        if (M->Name != NULL)
            strcpy(M->Name, Name);
        else
            LASError(LASMemAllocErr, "M_SetName", Name, NULL, NULL);
    }
}